

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void replace_defined(c2m_ctx_t c2m_ctx,VARR_token_t *expr_buffer)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  token_t ptVar4;
  node_t_conflict pnVar5;
  token_t *pptVar6;
  node_t_conflict pnVar7;
  VARR_token_t *unaff_RBX;
  int iVar8;
  char *tree;
  node_t pnVar9;
  char *pcVar10;
  node_t_conflict unaff_R12;
  c2m_ctx_t unaff_R13;
  token_t unaff_R14;
  node_t_conflict unaff_R15;
  bool bVar11;
  val vVar12;
  pos_t pVar13;
  macro_t tab_macro;
  macro macro_struct;
  val vStack_d0;
  val vStack_c0;
  VARR_token_t *pVStack_b0;
  node_t_conflict pnStack_a8;
  c2m_ctx_t pcStack_a0;
  token_t ptStack_98;
  node_t_conflict pnStack_90;
  node_t_conflict local_80;
  c2m_ctx_t local_78;
  pre_ctx *local_70;
  char *local_68;
  undefined8 uStack_60;
  macro_t local_58;
  macro local_50;
  
  tree = (char *)expr_buffer;
  local_78 = c2m_ctx;
  if (expr_buffer != (VARR_token_t *)0x0) {
    unaff_R12 = (node_t_conflict)expr_buffer->els_num;
    if (unaff_R12 != (node_t_conflict)0x0) {
      iVar8 = 0;
      local_70 = c2m_ctx->pre_ctx;
      unaff_R15 = (node_t_conflict)&DAT_00000001;
      do {
        pptVar6 = expr_buffer->varr;
        if (pptVar6 == (token_t *)0x0) {
          pnStack_90 = (node_t_conflict)0x1933e6;
          replace_defined_cold_3();
          unaff_R13 = (c2m_ctx_t)0x0;
LAB_001933e6:
          pnStack_90 = (node_t_conflict)0x1933eb;
          replace_defined_cold_2();
          unaff_RBX = expr_buffer;
          goto LAB_001933eb;
        }
        unaff_R14 = pptVar6[(long)(&unaff_R15[-1].u.ch + 0xf)];
        unaff_R13 = c2m_ctx;
        if (*(short *)unaff_R14 == 0x103) {
          unaff_R13 = (c2m_ctx_t)unaff_R14->repr;
          tree = "defined";
          pnStack_90 = (node_t_conflict)0x1931d2;
          iVar2 = strcmp((char *)unaff_R13,"defined");
          if (iVar2 == 0) {
            pnVar7 = unaff_R15;
            if ((unaff_R15 < unaff_R12) && (*(short *)pptVar6[(long)unaff_R15] == 0x20)) {
              pnVar7 = (node_t_conflict)((long)&unaff_R15->code + 1);
            }
            if (pnVar7 < unaff_R12) {
              unaff_R13 = (c2m_ctx_t)((long)&unaff_R15[-1].u + 0xf);
              sVar1 = *(short *)pptVar6[(long)pnVar7];
              if (sVar1 == 0x28) {
                pnVar5 = (node_t_conflict)((long)&pnVar7->code + 1);
                if ((pnVar5 < unaff_R12) &&
                   (*(short *)pptVar6[(long)((long)&pnVar7->code + 1)] == 0x20)) {
                  pnVar5 = (node_t_conflict)((long)&pnVar7->code + 2);
                }
                if ((pnVar5 < unaff_R12) && (*(short *)pptVar6[(long)pnVar5] == 0x103)) {
                  tree = (char *)((long)&pnVar5->code + 1);
                  if ((tree < unaff_R12) &&
                     (*(short *)pptVar6[(long)((long)&pnVar5->code + 1)] == 0x20)) {
                    tree = (char *)((long)&pnVar5->code + 2);
                  }
                  if ((tree < unaff_R12) && (*(short *)pptVar6[(long)tree] == 0x29)) {
                    pnStack_90 = (node_t_conflict)0x193358;
                    local_80 = (node_t_conflict)tree;
                    local_50.id = pptVar6[(long)pnVar5];
                    iVar2 = HTAB_macro_t_do(local_70->macro_tab,&local_50,HTAB_FIND,&local_58);
                    unaff_R12 = (node_t_conflict)0x1b530d;
                    if (iVar2 != 0) {
                      unaff_R12 = (node_t_conflict)0x1b3967;
                    }
                    local_68 = (unaff_R14->pos).fname;
                    uStack_60._0_4_ = (unaff_R14->pos).lno;
                    uStack_60._4_4_ = (unaff_R14->pos).ln_pos;
                    tree = (char *)0x30;
                    pnStack_90 = (node_t_conflict)0x193385;
                    c2m_ctx = local_78;
                    ptVar4 = (token_t)reg_malloc(local_78,0x30);
                    *(undefined4 *)ptVar4 = 0x100;
                    (ptVar4->pos).fname = local_68;
                    (ptVar4->pos).lno = (undefined4)uStack_60;
                    (ptVar4->pos).ln_pos = uStack_60._4_4_;
                    ptVar4->repr = (char *)unaff_R12;
                    ptVar4->node_code = N_IGNORE;
                    ptVar4->node = (node_t_conflict)0x0;
                    pptVar6 = expr_buffer->varr;
                    if ((pptVar6 != (token_t *)0x0) && (unaff_R13 < (c2m_ctx_t)expr_buffer->els_num)
                       ) goto LAB_001932ae;
                    goto LAB_001933f0;
                  }
                }
              }
              else if (sVar1 == 0x103) {
                pnStack_90 = (node_t_conflict)0x193247;
                local_80 = pnVar7;
                local_50.id = pptVar6[(long)pnVar7];
                iVar2 = HTAB_macro_t_do(local_70->macro_tab,&local_50,HTAB_FIND,&local_58);
                unaff_R12 = (node_t_conflict)0x1b530d;
                if (iVar2 != 0) {
                  unaff_R12 = (node_t_conflict)0x1b3967;
                }
                local_68 = (unaff_R14->pos).fname;
                uStack_60._0_4_ = (unaff_R14->pos).lno;
                uStack_60._4_4_ = (unaff_R14->pos).ln_pos;
                tree = (char *)0x30;
                pnStack_90 = (node_t_conflict)0x193274;
                c2m_ctx = local_78;
                ptVar4 = (token_t)reg_malloc(local_78,0x30);
                *(undefined4 *)ptVar4 = 0x100;
                (ptVar4->pos).fname = local_68;
                (ptVar4->pos).lno = (undefined4)uStack_60;
                (ptVar4->pos).ln_pos = uStack_60._4_4_;
                ptVar4->repr = (char *)unaff_R12;
                ptVar4->node_code = N_IGNORE;
                ptVar4->node = (node_t_conflict)0x0;
                pptVar6 = expr_buffer->varr;
                if ((pptVar6 == (token_t *)0x0) || ((c2m_ctx_t)expr_buffer->els_num <= unaff_R13))
                goto LAB_001933e6;
LAB_001932ae:
                pptVar6[(long)(&unaff_R15[-1].u.ch + 0xf)] = ptVar4;
                tree = (char *)((ulong)unaff_R15 & 0xffffffff);
                pnStack_90 = (node_t_conflict)0x1932c5;
                unaff_R13 = (c2m_ctx_t)expr_buffer;
                del_tokens(expr_buffer,(int)unaff_R15,(int)local_80 + iVar8);
              }
            }
          }
        }
        unaff_R12 = (node_t_conflict)expr_buffer->els_num;
        iVar8 = iVar8 + -1;
        bVar11 = unaff_R15 < unaff_R12;
        c2m_ctx = unaff_R13;
        unaff_R15 = (node_t_conflict)((long)&unaff_R15->code + 1);
      } while (bVar11);
    }
    return;
  }
LAB_001933eb:
  pnStack_90 = (node_t_conflict)0x1933f0;
  replace_defined_cold_4();
  expr_buffer = unaff_RBX;
LAB_001933f0:
  pnStack_90 = (node_t_conflict)eval;
  replace_defined_cold_1();
  pVStack_b0 = expr_buffer;
  pnStack_a8 = unaff_R12;
  pcStack_a0 = unaff_R13;
  ptStack_98 = unaff_R14;
  pnStack_90 = unaff_R15;
  switch(((node_t_conflict)tree)->code) {
  case N_IGNORE:
    pVar13 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                          (node_t_conflict)(ulong)((node_t_conflict)tree)->uid);
    error(c2m_ctx,0x1c15f3,pVar13.fname,pVar13._8_8_);
    break;
  case N_I:
  case N_L:
  case N_LL:
    break;
  case N_U:
  case N_UL:
  case N_ULL:
  case N_CH16:
  case N_CH32:
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
  case N_CH:
    break;
  case N_ANDAND:
  case N_OROR:
    vVar12 = eval(c2m_ctx,(((node_t_conflict)tree)->u).ops.head);
    if (((node_t_conflict)tree)->code == N_ANDAND) {
      if (vVar12.u.i_val == 0) {
        return;
      }
    }
    else if (vVar12.u.i_val != 0) {
      return;
    }
    pnVar9 = (((node_t_conflict)tree)->u).ops.head;
    if (pnVar9 == (node_t)0x0) {
      pnVar9 = (node_t_conflict)0x0;
    }
    else {
      pnVar9 = (pnVar9->op_link).next;
    }
    eval(c2m_ctx,pnVar9);
    break;
  case N_EQ:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_NE:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_LT:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_LE:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_GT:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_GE:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_BITWISE_NOT:
    eval(c2m_ctx,(((node_t_conflict)tree)->u).ops.head);
    break;
  case N_NOT:
    eval(c2m_ctx,(((node_t_conflict)tree)->u).ops.head);
    break;
  case N_AND:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_OR:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_XOR:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_LSH:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_RSH:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_ADD:
    pnVar9 = (((node_t_conflict)tree)->u).ops.head;
    if ((pnVar9 != (node_t)0x0) && ((pnVar9->op_link).next != (node_t)0x0)) {
      eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
      return;
    }
    goto LAB_001938c6;
  case N_SUB:
    pnVar7 = (((node_t_conflict)tree)->u).ops.head;
    if ((pnVar7 == (node_t_conflict)0x0) || ((pnVar7->op_link).next == (node_t)0x0)) {
      eval(c2m_ctx,pnVar7);
    }
    else {
      eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    }
    break;
  case N_MUL:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    break;
  case N_DIV:
  case N_MOD:
    eval_binop_operands(c2m_ctx,(node_t_conflict)tree,&vStack_d0,&vStack_c0);
    if (vStack_c0.u.i_val == 0) {
      pVar13 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                            (node_t_conflict)(ulong)((node_t_conflict)tree)->uid);
      pcVar10 = "%";
      if (((node_t_conflict)tree)->code == N_DIV) {
        pcVar10 = "/";
      }
      error(c2m_ctx,0x1c1611,pVar13.fname,pVar13._8_8_,pcVar10);
    }
    break;
  case N_COND:
    vVar12 = eval(c2m_ctx,(((node_t_conflict)tree)->u).ops.head);
    pnVar9 = (((node_t_conflict)tree)->u).ops.head;
    if (pnVar9 == (node_t)0x0) {
      pnVar9 = (node_t_conflict)0x0;
    }
    else {
      uVar3 = (uint)(vVar12.u.i_val == 0);
      do {
        pnVar9 = (pnVar9->op_link).next;
        bVar11 = uVar3 != 0;
        uVar3 = uVar3 - 1;
        if (pnVar9 == (node_t)0x0) break;
      } while (bVar11);
    }
LAB_001938c6:
    eval(c2m_ctx,pnVar9);
  }
  return;
}

Assistant:

static void replace_defined (c2m_ctx_t c2m_ctx, VARR (token_t) * expr_buffer) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  size_t i, j, k, len;
  token_t t, id;
  const char *res;
  struct macro macro_struct;
  macro_t tab_macro;

  for (i = 0; i < VARR_LENGTH (token_t, expr_buffer); i++) {
    /* Change defined ident and defined (ident) */
    t = VARR_GET (token_t, expr_buffer, i);
    if (t->code == T_ID && strcmp (t->repr, "defined") == 0) {
      j = i + 1;
      len = VARR_LENGTH (token_t, expr_buffer);
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len) continue;
      if ((id = VARR_GET (token_t, expr_buffer, j))->code == T_ID) {
        macro_struct.id = id;
        res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
        VARR_SET (token_t, expr_buffer, i,
                  new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
        del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
        continue;
      }
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != '(') continue;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != T_ID) continue;
      k = j;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != ')') continue;
      macro_struct.id = VARR_GET (token_t, expr_buffer, k);
      res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
      VARR_SET (token_t, expr_buffer, i,
                new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
      del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
    }
  }
}